

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int Pdr_ManPushClauses(Pdr_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pPVar7;
  Pdr_Set_t *pOld;
  void *pvVar8;
  abctime aVar9;
  int local_7c;
  Pdr_Set_t *pCubeMin;
  abctime clk;
  int Counter;
  int iStartFrame;
  int kMax;
  int RetValue2;
  int RetValue;
  int m;
  int k;
  int j;
  int i;
  Vec_Ptr_t *vArrayK1;
  Vec_Ptr_t *vArrayK;
  Pdr_Set_t *pCubeK1;
  Pdr_Set_t *pCubeK;
  Pdr_Set_t *pTemp;
  Pdr_Man_t *p_local;
  
  kMax = 0;
  iVar1 = Vec_PtrSize(p->vSolvers);
  if (p->pPars->fShiftStart == 0) {
    local_7c = 1;
  }
  else {
    local_7c = p->iUseFrame;
  }
  aVar5 = Abc_Clock();
  if (p->iUseFrame < 1) {
    __assert_fail("p->iUseFrame > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                  ,0x9d,"int Pdr_ManPushClauses(Pdr_Man_t *)");
  }
  RetValue = local_7c;
  do {
    if (iVar1 + -1 <= RetValue) {
      pVVar6 = Vec_VecEntry(p->vClauses,iVar1 + -1);
      Vec_PtrSort(pVVar6,Pdr_SetCompare);
      for (m = 0; iVar1 = Vec_PtrSize(pVVar6), m < iVar1; m = m + 1) {
        pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(pVVar6,m);
        iVar1 = m;
        while( true ) {
          iVar2 = iVar1;
          RetValue2 = iVar2 + 1;
          iVar1 = Vec_PtrSize(pVVar6);
          if (iVar1 <= RetValue2) break;
          pOld = (Pdr_Set_t *)Vec_PtrEntry(pVVar6,RetValue2);
          iVar4 = Pdr_SetContains(pOld,pPVar7);
          iVar1 = RetValue2;
          if (iVar4 != 0) {
            Pdr_SetDeref(pOld);
            pvVar8 = Vec_PtrEntryLast(pVVar6);
            Vec_PtrWriteEntry(pVVar6,RetValue2,pvVar8);
            Vec_PtrPop(pVVar6);
            iVar1 = iVar2;
          }
        }
      }
      aVar9 = Abc_Clock();
      p->tPush = (aVar9 - aVar5) + p->tPush;
      return kMax;
    }
    pVVar6 = Vec_VecEntry(p->vClauses,RetValue);
    Vec_PtrSort(pVVar6,Pdr_SetCompare);
    p_00 = Vec_VecEntry(p->vClauses,RetValue + 1);
    for (m = 0; iVar2 = Vec_PtrSize(pVVar6), m < iVar2; m = m + 1) {
      pCubeK1 = (Pdr_Set_t *)Vec_PtrEntry(pVVar6,m);
      iVar2 = m;
      while( true ) {
        iVar4 = iVar2;
        RetValue2 = iVar4 + 1;
        iVar2 = Vec_PtrSize(pVVar6);
        if (iVar2 <= RetValue2) break;
        pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(pVVar6,RetValue2);
        iVar3 = Pdr_SetContains(pPVar7,pCubeK1);
        iVar2 = RetValue2;
        if (iVar3 != 0) {
          Pdr_SetDeref(pPVar7);
          pvVar8 = Vec_PtrEntryLast(pVVar6);
          Vec_PtrWriteEntry(pVVar6,RetValue2,pvVar8);
          Vec_PtrPop(pVVar6);
          iVar2 = iVar4;
        }
      }
      iVar2 = Pdr_ManCheckCube(p,RetValue,pCubeK1,(Pdr_Set_t **)0x0,0,0,1);
      if (iVar2 == -1) {
        return -1;
      }
      if (iVar2 != 0) {
        pPVar7 = Pdr_ManReduceClause(p,RetValue,pCubeK1);
        if (pPVar7 != (Pdr_Set_t *)0x0) {
          Pdr_SetDeref(pCubeK1);
          pCubeK1 = pPVar7;
        }
        Pdr_ManSolverAddClause(p,RetValue + 1,pCubeK1);
        for (k = 0; iVar2 = Vec_PtrSize(p_00), k < iVar2; k = k + 1) {
          pPVar7 = (Pdr_Set_t *)Vec_PtrEntry(p_00,k);
          iVar2 = Pdr_SetContains(pPVar7,pCubeK1);
          if (iVar2 != 0) {
            Pdr_SetDeref(pPVar7);
            pvVar8 = Vec_PtrEntryLast(p_00);
            Vec_PtrWriteEntry(p_00,k,pvVar8);
            Vec_PtrPop(p_00);
            k = k + -1;
          }
        }
        Vec_PtrPush(p_00,pCubeK1);
        pvVar8 = Vec_PtrEntryLast(pVVar6);
        Vec_PtrWriteEntry(pVVar6,m,pvVar8);
        Vec_PtrPop(pVVar6);
        m = m + -1;
      }
    }
    iVar2 = Vec_PtrSize(pVVar6);
    if (iVar2 == 0) {
      kMax = 1;
    }
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

int Pdr_ManPushClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pTemp, * pCubeK, * pCubeK1;
    Vec_Ptr_t * vArrayK, * vArrayK1;
    int i, j, k, m, RetValue = 0, RetValue2, kMax = Vec_PtrSize(p->vSolvers)-1;
    int iStartFrame = p->pPars->fShiftStart ? p->iUseFrame : 1;
    int Counter = 0;
    abctime clk = Abc_Clock();
    assert( p->iUseFrame > 0 );
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        vArrayK1 = Vec_VecEntry( p->vClauses, k+1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            Counter++;

            // remove cubes in the same frame that are contained by pCubeK
            Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
            {
                if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                    continue;
                Pdr_SetDeref( pTemp );
                Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
                Vec_PtrPop(vArrayK);
                m--;
            }

            // check if the clause can be moved to the next frame
            RetValue2 = Pdr_ManCheckCube( p, k, pCubeK, NULL, 0, 0, 1 );
            if ( RetValue2 == -1 )
                return -1;
            if ( !RetValue2 )
                continue;

            {
                Pdr_Set_t * pCubeMin;
                pCubeMin = Pdr_ManReduceClause( p, k, pCubeK );
                if ( pCubeMin != NULL )
                {
//                Abc_Print( 1, "%d ", pCubeK->nLits - pCubeMin->nLits );
                    Pdr_SetDeref( pCubeK );
                    pCubeK = pCubeMin;
                }
            }

            // if it can be moved, add it to the next frame
            Pdr_ManSolverAddClause( p, k+1, pCubeK );
            // check if the clause subsumes others
            Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK1, pCubeK1, i )
            {
                if ( !Pdr_SetContains( pCubeK1, pCubeK ) ) // pCubeK contains pCubeK1
                    continue;
                Pdr_SetDeref( pCubeK1 );
                Vec_PtrWriteEntry( vArrayK1, i, Vec_PtrEntryLast(vArrayK1) );
                Vec_PtrPop(vArrayK1);
                i--;
            }
            // add the last clause
            Vec_PtrPush( vArrayK1, pCubeK );
            Vec_PtrWriteEntry( vArrayK, j, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            j--;
        }
        if ( Vec_PtrSize(vArrayK) == 0 )
            RetValue = 1;
    }

    // clean up the last one
    vArrayK = Vec_VecEntry( p->vClauses, kMax );
    Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
    Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
    {
        // remove cubes in the same frame that are contained by pCubeK
        Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
        {
            if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                continue;
/*
            Abc_Print( 1, "===\n" );
            Pdr_SetPrint( stdout, pCubeK, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
            Pdr_SetPrint( stdout, pTemp, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
*/
            Pdr_SetDeref( pTemp );
            Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            m--;
        }
    }
    p->tPush += Abc_Clock() - clk;
    return RetValue;
}